

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O2

void av1_calc_mb_wiener_var_row
               (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,int mi_row,int16_t *src_diff,
               tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,double *sum_rec_distortion,
               double *sum_est_rate,uint8_t *pred_buffer)

{
  byte bVar1;
  _Bool _Var2;
  BLOCK_SIZE sb_size;
  uint uVar3;
  uint uVar4;
  SequenceHeader *pSVar5;
  WeberStats *pWVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  TX_SIZE tx_size;
  uint uVar10;
  uint16_t *puVar11;
  AV1_COMP *pAVar12;
  uint8_t *pred8;
  BitDepthInfo BVar13;
  int16_t *piVar14;
  tran_low_t *ptVar15;
  short sVar16;
  int mi_ext_col;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  MB_MODE_INFO *pMVar22;
  int iVar23;
  MB_MODE_INFO **ppMVar24;
  int idx;
  MACROBLOCKD *pMVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  int64_t iVar30;
  uint8_t *puVar31;
  long lVar32;
  bool bVar33;
  byte bVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  byte bVar39;
  int pix_col;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  double dVar44;
  uint16_t eob;
  BLOCK_SIZE local_241;
  MACROBLOCKD *local_240;
  uint local_234;
  MACROBLOCK *local_230;
  uint8_t *local_228;
  int local_21c;
  uint local_218;
  int local_214;
  ulong local_210;
  ulong local_208;
  AV1_COMP *local_200;
  long local_1f8;
  ulong local_1f0;
  uint local_1e8;
  int est_block_rate;
  ulong local_1e0;
  uint8_t *local_1d8;
  uint16_t *local_1d0;
  ulong local_1c8;
  SCAN_ORDER *local_1c0;
  uint16_t *local_1b8;
  ulong local_1b0;
  uint8_t *local_1a8;
  ulong local_1a0;
  uint local_198;
  int local_194;
  uint local_190;
  int local_18c;
  AV1EncRowMultiThreadSync *local_188;
  ulong local_180;
  uint8_t *local_178;
  long local_170;
  BitDepthInfo local_168;
  int16_t *local_160;
  tran_low_t *local_158;
  ulong local_150;
  uint16_t *rec;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  int64_t local_118;
  MB_MODE_INFO *mbmi_ptr;
  QUANT_PARAM quant_param;
  MB_MODE_INFO mbmi;
  
  iVar18 = (cpi->source->field_4).field_0.y_stride;
  local_1f8 = (long)iVar18;
  local_178 = (cpi->source->field_5).buffers[0] + iVar18 * mi_row * 4;
  local_1c8 = 0;
  local_230 = x;
  local_160 = src_diff;
  local_158 = coeff;
  memset(&mbmi,0,0xb0);
  xd->mi = &mbmi_ptr;
  local_241 = cpi->weber_bsize;
  local_180 = (ulong)local_241;
  local_1f0 = (ulong)""[local_180];
  uVar26 = tx_size_wide[local_1f0];
  local_1a0 = (ulong)uVar26;
  local_150 = (ulong)(uVar26 * uVar26);
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_180];
  local_1e0 = (ulong)bVar1;
  uVar28 = (uint)xd->cur_buf->flags >> 3;
  local_168 = (BitDepthInfo)(CONCAT44(uVar28,xd->bd) & 0x1ffffffff);
  local_188 = &cpi->ppi->intra_row_mt_sync;
  uVar3 = (cpi->common).mi_params.mi_cols;
  uVar20 = (ulong)uVar3;
  uVar36 = (long)mi_row / (long)(int)(uint)bVar1 & 0xffffffff;
  local_194 = (int)(uVar3 + 8) / 0x10;
  local_1d8 = (uint8_t *)((ulong)pred_buffer >> 1);
  if ((uVar28 & 1) == 0) {
    local_1d8 = pred_buffer;
  }
  local_138 = 0x3efffcL >> (local_241 & 0x3f);
  local_18c = mi_row * -0x20;
  local_140 = 0x20005L >> (local_241 & 0x3f);
  local_1c0 = av1_scan_orders[""[local_180]];
  local_170 = (long)(int)uVar26;
  local_120 = 0;
  if (0 < (int)uVar26) {
    local_120 = (ulong)uVar26;
  }
  local_198 = mi_row - 1;
  local_190 = bVar1 - 1;
  local_1e8 = (uint)bVar1 * 4;
  rec = (uint16_t *)((long)local_1d8 * 2);
  local_128 = local_1f8 * 2;
  local_21c = 0;
  local_234 = (uint)((long)mi_row / (long)(int)(uint)bVar1);
  uVar40 = 0;
  local_240 = xd;
  local_208 = (ulong)(uint)mi_row;
  local_200 = cpi;
  local_130 = uVar20;
  mbmi_ptr = &mbmi;
  while (uVar37 = local_1e0, uVar26 = (uint)uVar40, (int)uVar26 < (int)uVar20) {
    if ((uVar40 & 0xf) == 0) {
      (*(cpi->mt_info).intra_mt.intra_sync_read_ptr)(local_188,(int)uVar36,local_21c);
      iVar18 = (cpi->mt_info).num_workers;
      iVar17 = (cpi->mt_info).num_mod_workers[0xb];
      if (iVar17 < iVar18) {
        iVar18 = iVar17;
      }
      if (1 < iVar18) {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        _Var2 = (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        if (_Var2 != false) break;
      }
    }
    bVar21 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_180]
    ;
    iVar18 = (cpi->common).mi_params.mi_stride;
    uVar28 = (uint)local_208;
    iVar17 = (int)uVar26 /
             (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [(cpi->common).mi_params.mi_alloc_bsize];
    iVar19 = (int)((long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | local_208 & 0xffffffff) /
                  (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [(cpi->common).mi_params.mi_alloc_bsize]);
    iVar35 = iVar18 * uVar28 + uVar26;
    (cpi->common).mi_params.mi_grid_base[iVar35] =
         (cpi->common).mi_params.mi_alloc +
         ((cpi->common).mi_params.mi_alloc_stride * iVar19 + iVar17);
    ppMVar24 = (cpi->common).mi_params.mi_grid_base + iVar35;
    local_240->mi = ppMVar24;
    local_240->tx_type_map = (cpi->common).mi_params.tx_type_map + iVar35;
    local_240->tx_type_map_stride = iVar18;
    local_230->mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base + (iVar19 * (cpi->mbmi_ext_info).stride + iVar17);
    iVar17 = bVar21 + uVar28;
    iVar18 = (cpi->common).mi_params.mi_rows;
    uVar3 = (cpi->common).mi_params.mi_cols;
    if (iVar17 < iVar18) {
      iVar18 = iVar17;
    }
    local_218 = uVar26 + (int)uVar37;
    if ((int)local_218 < (int)uVar3) {
      uVar3 = local_218;
    }
    local_240->mb_to_top_edge = local_18c;
    local_240->mb_to_bottom_edge = (iVar18 - iVar17) * 0x20;
    local_240->mb_to_left_edge = uVar26 * -0x20;
    local_240->mb_to_right_edge = (uVar3 - local_218) * 0x20;
    local_240->mi_row = uVar28;
    local_240->mi_col = uVar26;
    iVar18 = (local_240->tile).mi_row_start;
    iVar17 = (local_240->tile).mi_col_start;
    local_240->left_available = iVar17 < (int)uVar26;
    local_240->up_available = iVar18 < (int)uVar28;
    uVar3 = local_240->plane[1].subsampling_x;
    uVar4 = local_240->plane[1].subsampling_y;
    local_240->chroma_up_available = iVar18 < (int)uVar28;
    bVar33 = iVar17 < (int)(uVar26 - 1);
    if (uVar3 == 0) {
      bVar33 = iVar17 < (int)uVar26;
    }
    if ((local_138 & 1) != 0) {
      bVar33 = iVar17 < (int)uVar26;
    }
    local_240->chroma_left_available = bVar33;
    uVar10 = uVar28;
    if (uVar4 != 0 && (local_140 & 1) != 0) {
      local_240->chroma_up_available = iVar18 < (int)local_198;
      uVar10 = local_198;
    }
    if (iVar18 < (int)uVar28) {
      pMVar22 = ppMVar24[-(long)local_240->mi_stride];
    }
    else {
      pMVar22 = (MB_MODE_INFO *)0x0;
    }
    local_240->above_mbmi = pMVar22;
    if (iVar17 < (int)uVar26) {
      pMVar22 = ppMVar24[-1];
    }
    else {
      pMVar22 = (MB_MODE_INFO *)0x0;
    }
    local_240->left_mbmi = pMVar22;
    if (((local_208 & 1) == 0) && ((bVar21 & uVar4 != 0) != 0)) {
      local_240->is_chroma_ref = false;
    }
    else {
      if ((uVar40 & 1) == 0 && (bVar1 & 1) != 0) {
        local_240->is_chroma_ref = uVar3 == 0;
        if (uVar3 != 0) goto LAB_0017e29f;
      }
      else {
        local_240->is_chroma_ref = true;
      }
      iVar19 = local_240->mi_stride;
      iVar35 = (uVar3 & uVar26) + (uVar4 & uVar28) * iVar19;
      if (iVar18 < (int)uVar10) {
        pMVar22 = ppMVar24[(long)-iVar35 + (long)(int)(uVar3 - iVar19)];
      }
      else {
        pMVar22 = (MB_MODE_INFO *)0x0;
      }
      local_240->chroma_above_mbmi = pMVar22;
      if (bVar33 == false) {
        pMVar22 = (MB_MODE_INFO *)0x0;
      }
      else {
        pMVar22 = ppMVar24[(long)-iVar35 + (long)(int)(iVar19 * uVar4) + -1];
      }
      local_240->chroma_left_mbmi = pMVar22;
    }
LAB_0017e29f:
    local_240->height = bVar21;
    local_240->width = bVar1;
    local_240->is_last_vertical_rect = false;
    if ((bVar1 < bVar21) && ((local_218 & bVar21 - 1) == 0)) {
      local_240->is_last_vertical_rect = true;
    }
    local_1a8 = local_178 + (local_1c8 & 0xffffffff);
    local_240->is_first_horizontal_rect = bVar21 < bVar1 && (uVar28 & local_190) == 0;
    lVar29 = 0xa30;
    if (((local_200->common).seq_params)->monochrome == '\0') {
      lVar29 = 0x1e90;
    }
    for (lVar32 = 0; lVar29 != lVar32; lVar32 = lVar32 + 0xa30) {
      bVar34 = (byte)(((uint)bVar21 << 2) >>
                     (*(byte *)((long)local_240->plane[0].pre + lVar32 + -0x28) & 0x1f));
      bVar39 = (byte)(local_1e8 >>
                     (*(byte *)((long)local_240->plane[0].pre + lVar32 + -0x2c) & 0x1f));
      if (bVar39 < 5) {
        bVar39 = 4;
      }
      *(byte *)((long)(local_240->plane[0].seg_iqmatrix + -1) + lVar32 + 0x90) = bVar39;
      if (bVar34 < 5) {
        bVar34 = 4;
      }
      *(byte *)((long)(local_240->plane[0].seg_iqmatrix + -1) + lVar32 + 0x91) = bVar34;
    }
    pMVar22 = *ppMVar24;
    pMVar22->bsize = local_241;
    pMVar22->motion_mode = '\0';
    if (iVar18 < (int)uVar28) {
      local_240->above_mbmi = (MB_MODE_INFO *)0x0;
    }
    if (iVar17 < (int)uVar26) {
      local_240->left_mbmi = (MB_MODE_INFO *)0x0;
    }
    local_228 = local_178 + uVar26 * 4;
    local_214 = 0x7fffffff;
    uVar20 = 0;
    uVar36 = 0;
    pMVar25 = local_240;
    local_210 = uVar40;
    while( true ) {
      lVar32 = local_170;
      pred8 = local_1d8;
      lVar29 = local_1f8;
      pAVar12 = local_200;
      puVar31 = local_228;
      pSVar5 = (local_200->common).seq_params;
      sb_size = pSVar5->sb_size;
      uVar26 = (uint)pSVar5->enable_intra_edge_filter;
      iVar17 = (int)local_170;
      iVar18 = (int)local_1a0;
      if ((PREDICTION_MODE)uVar20 == '\r') break;
      local_1b8 = (uint16_t *)(uVar20 & 0xff);
      local_1b0 = CONCAT44(local_1b0._4_4_,(int)uVar20);
      local_1d0 = (uint16_t *)(uVar36 & 0xff);
      av1_predict_intra_block
                (pMVar25,sb_size,uVar26,iVar17,iVar18,(TX_SIZE)local_1f0,(PREDICTION_MODE)uVar20,0,0
                 ,'\x05',local_228,(int)local_1f8,local_1d8,0x80,0,0,0);
      piVar14 = local_160;
      BVar13 = local_168;
      pMVar25 = local_240;
      av1_subtract_block(local_168,iVar17,iVar18,local_160,lVar32,puVar31,lVar29,pred8,0x80);
      ptVar15 = local_158;
      av1_quick_txfm(0,(TX_SIZE)local_1f0,BVar13,piVar14,iVar17,local_158);
      iVar18 = (*aom_satd)(ptVar15,(int)local_150);
      puVar11 = local_1d0;
      if (iVar18 < local_214) {
        puVar11 = local_1b8;
        local_214 = iVar18;
      }
      uVar36 = (ulong)puVar11 & 0xffffffff;
      uVar20 = (ulong)CONCAT31((int3)(local_1b0 >> 8),(char)local_1b0 + '\x01');
    }
    av1_predict_intra_block
              (pMVar25,sb_size,uVar26,iVar18,iVar17,(TX_SIZE)local_1f0,(PREDICTION_MODE)uVar36,0,0,
               '\x05',local_228,(int)local_1f8,local_1d8,0x80,0,0,0);
    piVar14 = local_160;
    BVar13 = local_168;
    av1_subtract_block(local_168,iVar18,iVar17,local_160,lVar32,puVar31,local_1f8,local_1d8,0x80);
    ptVar15 = local_158;
    uVar20 = local_1f0;
    tx_size = (TX_SIZE)local_1f0;
    av1_quick_txfm(0,tx_size,BVar13,piVar14,iVar18,local_158);
    bVar21 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[uVar20]];
    av1_setup_quant(tx_size,0,0,0,&quant_param);
    local_1b8 = (uint16_t *)(long)(1 << (bVar21 & 0x1f));
    if ((local_240->cur_buf->flags & 8) == 0) {
      av1_quantize_fp_facade
                (ptVar15,(intptr_t)local_1b8,local_230->plane,qcoeff,dqcoeff,&eob,local_1c0,
                 &quant_param);
    }
    else {
      av1_highbd_quantize_fp_facade
                (ptVar15,(intptr_t)local_1b8,local_230->plane,qcoeff,dqcoeff,&eob,local_1c0,
                 &quant_param);
    }
    uVar20 = local_1e0;
    if ((pAVar12->oxcf).enable_rate_guide_deltaq != 0) {
      uVar40 = (ulong)eob;
      iVar18 = 1;
      for (uVar36 = (ulong)(uint)(0 << (bVar21 & 0x1f)); uVar40 != uVar36; uVar36 = uVar36 + 1) {
        iVar17 = qcoeff[((SCAN_ORDER *)&local_1c0->scan)->scan[uVar36]];
        iVar19 = -iVar17;
        if (0 < iVar17) {
          iVar19 = iVar17;
        }
        dVar44 = log1p((double)iVar19);
        iVar18 = (iVar18 - (uint)(iVar17 == 0)) + (int)(dVar44 / 0.6931471805599453) + 2;
      }
      pAVar12->prep_rate_estimates
      [(int)((int)((local_210 & 0xffffffff) / (uVar20 & 0xffffffff)) +
            (pAVar12->frame_info).mi_cols * local_234)] = iVar18 << 9;
    }
    puVar31 = local_1d8;
    uVar36 = local_210;
    uVar26 = local_234;
    pMVar25 = local_240;
    av1_inverse_transform_block
              (local_240,dqcoeff,0,'\0',(TX_SIZE)local_1f0,local_1d8,0x80,(uint)eob,0);
    pWVar6 = pAVar12->mb_weber_stats;
    iVar18 = (int)((uVar36 & 0xffffffff) / (uVar20 & 0xffffffff)) +
             (pAVar12->frame_info).mi_cols * uVar26;
    pWVar6[iVar18].src_pix_max = 1;
    pWVar6[iVar18].rec_pix_max = 1;
    pWVar6[iVar18].src_variance = 0;
    (&pWVar6[iVar18].src_variance)[1] = 0;
    pWVar6[iVar18].distortion = 0;
    local_228 = (uint8_t *)((long)local_228 * 2);
    uVar20 = 1;
    local_1d0 = rec;
    uVar36 = 1;
    lVar29 = 0;
    iVar30 = 0;
    lVar32 = 0;
    lVar27 = 0;
    lVar42 = 0;
    lVar41 = 0;
    uVar40 = 0;
    while (uVar37 = uVar40, uVar37 != local_120) {
      for (uVar40 = 0; local_1a0 != uVar40; uVar40 = uVar40 + 1) {
        if ((pMVar25->cur_buf->flags & 8) == 0) {
          uVar43 = (ulong)local_1a8[uVar40];
          uVar38 = (ulong)puVar31[uVar40];
        }
        else {
          uVar43 = (ulong)*(ushort *)((long)local_228 + uVar40 * 2);
          uVar38 = (ulong)local_1d0[uVar40];
        }
        iVar35 = (int)uVar43;
        lVar27 = lVar27 + uVar43;
        iVar19 = (int)uVar38;
        lVar42 = lVar42 + uVar38;
        iVar17 = iVar35 - iVar19;
        lVar41 = lVar41 + iVar17;
        iVar30 = iVar30 + (ulong)(uint)(iVar35 * iVar35);
        pWVar6[iVar18].src_variance = iVar30;
        lVar29 = lVar29 + (ulong)(uint)(iVar19 * iVar19);
        pWVar6[iVar18].rec_variance = lVar29;
        sVar16 = (short)uVar36;
        uVar36 = (ulong)(uint)(int)sVar16;
        if (sVar16 <= iVar35) {
          uVar36 = uVar43;
        }
        pWVar6[iVar18].src_pix_max = (int16_t)uVar36;
        sVar16 = (short)uVar20;
        uVar20 = (ulong)(uint)(int)sVar16;
        if (sVar16 <= iVar19) {
          uVar20 = uVar38;
        }
        pWVar6[iVar18].rec_pix_max = (int16_t)uVar20;
        lVar32 = lVar32 + (ulong)(uint)(iVar17 * iVar17);
        pWVar6[iVar18].distortion = lVar32;
        pMVar25 = local_240;
      }
      puVar31 = puVar31 + 0x80;
      local_1a8 = local_1a8 + local_1f8;
      local_1d0 = local_1d0 + 0x80;
      local_228 = (uint8_t *)((long)local_228 + local_128);
      local_1b0 = uVar37;
      uVar40 = uVar37 + 1;
    }
    if ((local_200->oxcf).intra_mode_cfg.auto_intra_tools_off != false) {
      *sum_rec_distortion = (double)lVar32 + *sum_rec_distortion;
      est_block_rate = 0;
      local_118 = 0;
      bVar21 = 3;
      if ((((local_230->e_mbd).cur_buf)->flags & 8) != 0) {
        bVar21 = (char)(local_230->e_mbd).bd - 5;
      }
      if ((local_200->sf).rd_sf.simple_model_rd_from_var == 0) {
        av1_model_rd_from_var_lapndz
                  (pWVar6[iVar18].distortion,
                   (uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_180],
                   (int)local_230->plane[0].dequant_QTX[1] >> (bVar21 & 0x1f),&est_block_rate,
                   &local_118);
        iVar17 = est_block_rate;
      }
      else {
        iVar19 = (int)local_230->plane[0].dequant_QTX[1] >> (bVar21 & 0x1f);
        iVar17 = 0;
        if (iVar19 < 0x78) {
          lVar29 = (long)(pWVar6[iVar18].distortion * (ulong)(0x118 - iVar19)) >> 7;
          if (0x7ffffffe < lVar29) {
            lVar29 = 0x7fffffff;
          }
          iVar17 = (int)lVar29;
        }
      }
      *sum_est_rate = (double)iVar17 + *sum_est_rate;
      iVar30 = pWVar6[iVar18].src_variance;
      lVar29 = pWVar6[iVar18].rec_variance;
      lVar32 = pWVar6[iVar18].distortion;
    }
    uVar20 = local_130;
    cpi = local_200;
    iVar17 = local_21c;
    uVar26 = local_234;
    iVar19 = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = lVar27 * lVar27;
    pWVar6[iVar18].src_variance = iVar30 - SUB168(auVar7 / SEXT816((long)local_1b8),0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = lVar42 * lVar42;
    pWVar6[iVar18].rec_variance = lVar29 - SUB168(auVar8 / SEXT816((long)local_1b8),0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = lVar41 * lVar41;
    pWVar6[iVar18].distortion = lVar32 - SUB168(auVar9 / SEXT816((long)local_1b8),0);
    pWVar6[iVar18].satd = (long)local_214;
    *qcoeff = 0;
    for (uVar36 = 1; uVar36 < local_150; uVar36 = uVar36 + 1) {
      iVar35 = qcoeff[uVar36];
      iVar23 = -iVar35;
      if (0 < iVar35) {
        iVar23 = iVar35;
      }
      if (iVar19 <= iVar23) {
        iVar19 = iVar23;
      }
    }
    pWVar6[iVar18].max_scale = (double)iVar19;
    if ((int)local_130 <= (int)local_218 || (local_218 & 0xf) == 0) {
      (*(local_200->mt_info).intra_mt.intra_sync_write_ptr)(local_188,local_234,local_21c,local_194)
      ;
      local_21c = iVar17 + 1;
    }
    uVar36 = (ulong)uVar26;
    local_1c8 = (ulong)((int)local_1c8 + local_1e8);
    uVar40 = (ulong)local_218;
  }
  local_240->mi = (MB_MODE_INFO **)0x0;
  return;
}

Assistant:

void av1_calc_mb_wiener_var_row(AV1_COMP *const cpi, MACROBLOCK *x,
                                MACROBLOCKD *xd, const int mi_row,
                                int16_t *src_diff, tran_low_t *coeff,
                                tran_low_t *qcoeff, tran_low_t *dqcoeff,
                                double *sum_rec_distortion,
                                double *sum_est_rate, uint8_t *pred_buffer) {
  AV1_COMMON *const cm = &cpi->common;
  uint8_t *buffer = cpi->source->y_buffer;
  int buf_stride = cpi->source->y_stride;
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const int block_size = tx_size_wide[tx_size];
  const int coeff_count = block_size * block_size;
  const int mb_step = mi_size_wide[bsize];
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  const MultiThreadInfo *const mt_info = &cpi->mt_info;
  const AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mt_thread_id = mi_row / mb_step;
  // TODO(chengchen): test different unit step size
  const int mt_unit_step = mi_size_wide[MB_WIENER_MT_UNIT_SIZE];
  const int mt_unit_cols = (mi_cols + (mt_unit_step >> 1)) / mt_unit_step;
  int mt_unit_col = 0;
  const int is_high_bitdepth = is_cur_buf_hbd(xd);

  uint8_t *dst_buffer = pred_buffer;
  const int dst_buffer_stride = MB_WIENER_PRED_BUF_STRIDE;

  if (is_high_bitdepth) {
    uint16_t *pred_buffer_16 = (uint16_t *)pred_buffer;
    dst_buffer = CONVERT_TO_BYTEPTR(pred_buffer_16);
  }

  for (int mi_col = 0; mi_col < mi_cols; mi_col += mb_step) {
    if (mi_col % mt_unit_step == 0) {
      intra_mt->intra_sync_read_ptr(intra_row_mt_sync, mt_thread_id,
                                    mt_unit_col);
#if CONFIG_MULTITHREAD
      const int num_workers =
          AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
      if (num_workers > 1) {
        const AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
        pthread_mutex_lock(enc_row_mt->mutex_);
        const bool exit = enc_row_mt->mb_wiener_mt_exit;
        pthread_mutex_unlock(enc_row_mt->mutex_);
        // Stop further processing in case any worker has encountered an error.
        if (exit) break;
      }
#endif
    }

    PREDICTION_MODE best_mode = DC_PRED;
    int best_intra_cost = INT_MAX;
    const int mi_width = mi_size_wide[bsize];
    const int mi_height = mi_size_high[bsize];
    set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                          mi_row, mi_col);
    set_mi_row_col(xd, &xd->tile, mi_row, mi_height, mi_col, mi_width,
                   AOMMIN(mi_row + mi_height, cm->mi_params.mi_rows),
                   AOMMIN(mi_col + mi_width, cm->mi_params.mi_cols));
    set_plane_n4(xd, mi_size_wide[bsize], mi_size_high[bsize],
                 av1_num_planes(cm));
    xd->mi[0]->bsize = bsize;
    xd->mi[0]->motion_mode = SIMPLE_TRANSLATION;
    // Set above and left mbmi to NULL as they are not available in the
    // preprocessing stage.
    // They are used to detemine intra edge filter types in intra prediction.
    if (xd->up_available) {
      xd->above_mbmi = NULL;
    }
    if (xd->left_available) {
      xd->left_mbmi = NULL;
    }
    uint8_t *mb_buffer =
        buffer + mi_row * MI_SIZE * buf_stride + mi_col * MI_SIZE;
    for (PREDICTION_MODE mode = INTRA_MODE_START; mode < INTRA_MODE_END;
         ++mode) {
      // TODO(chengchen): Here we use src instead of reconstructed frame as
      // the intra predictor to make single and multithread version match.
      // Ideally we want to use the reconstructed.
      av1_predict_intra_block(
          xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
          block_size, block_size, tx_size, mode, 0, 0, FILTER_INTRA_MODES,
          mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
      av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                         mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
      av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);
      int intra_cost = aom_satd(coeff, coeff_count);
      if (intra_cost < best_intra_cost) {
        best_intra_cost = intra_cost;
        best_mode = mode;
      }
    }

    av1_predict_intra_block(
        xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
        block_size, block_size, tx_size, best_mode, 0, 0, FILTER_INTRA_MODES,
        mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
    av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                       mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
    av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);

    const struct macroblock_plane *const p = &x->plane[0];
    uint16_t eob;
    const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
    QUANT_PARAM quant_param;
    int pix_num = 1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]];
    av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_FP, 0, &quant_param);
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      av1_highbd_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                                    scan_order, &quant_param);
    } else {
      av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                             scan_order, &quant_param);
    }
#else
    av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob, scan_order,
                           &quant_param);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    if (cpi->oxcf.enable_rate_guide_deltaq) {
      const int rate_cost = rate_estimator(qcoeff, eob, tx_size);
      cpi->prep_rate_estimates[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                               (mi_col / mb_step)] = rate_cost;
    }

    av1_inverse_transform_block(xd, dqcoeff, 0, DCT_DCT, tx_size, dst_buffer,
                                dst_buffer_stride, eob, 0);
    WeberStats *weber_stats =
        &cpi->mb_weber_stats[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                             (mi_col / mb_step)];

    weber_stats->rec_pix_max = 1;
    weber_stats->rec_variance = 0;
    weber_stats->src_pix_max = 1;
    weber_stats->src_variance = 0;
    weber_stats->distortion = 0;

    int64_t src_mean = 0;
    int64_t rec_mean = 0;
    int64_t dist_mean = 0;

    for (int pix_row = 0; pix_row < block_size; ++pix_row) {
      for (int pix_col = 0; pix_col < block_size; ++pix_col) {
        int src_pix, rec_pix;
#if CONFIG_AV1_HIGHBITDEPTH
        if (is_cur_buf_hbd(xd)) {
          uint16_t *src = CONVERT_TO_SHORTPTR(mb_buffer);
          uint16_t *rec = CONVERT_TO_SHORTPTR(dst_buffer);
          src_pix = src[pix_row * buf_stride + pix_col];
          rec_pix = rec[pix_row * dst_buffer_stride + pix_col];
        } else {
          src_pix = mb_buffer[pix_row * buf_stride + pix_col];
          rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
        }
#else
        src_pix = mb_buffer[pix_row * buf_stride + pix_col];
        rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
#endif
        src_mean += src_pix;
        rec_mean += rec_pix;
        dist_mean += src_pix - rec_pix;
        weber_stats->src_variance += src_pix * src_pix;
        weber_stats->rec_variance += rec_pix * rec_pix;
        weber_stats->src_pix_max = AOMMAX(weber_stats->src_pix_max, src_pix);
        weber_stats->rec_pix_max = AOMMAX(weber_stats->rec_pix_max, rec_pix);
        weber_stats->distortion += (src_pix - rec_pix) * (src_pix - rec_pix);
      }
    }

    if (cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
      *sum_rec_distortion += weber_stats->distortion;
      int est_block_rate = 0;
      int64_t est_block_dist = 0;
      model_rd_sse_fn[MODELRD_LEGACY](cpi, x, bsize, 0, weber_stats->distortion,
                                      pix_num, &est_block_rate,
                                      &est_block_dist);
      *sum_est_rate += est_block_rate;
    }

    weber_stats->src_variance -= (src_mean * src_mean) / pix_num;
    weber_stats->rec_variance -= (rec_mean * rec_mean) / pix_num;
    weber_stats->distortion -= (dist_mean * dist_mean) / pix_num;
    weber_stats->satd = best_intra_cost;

    qcoeff[0] = 0;
    int max_scale = 0;
    for (int idx = 1; idx < coeff_count; ++idx) {
      const int abs_qcoeff = abs(qcoeff[idx]);
      max_scale = AOMMAX(max_scale, abs_qcoeff);
    }
    weber_stats->max_scale = max_scale;

    if ((mi_col + mb_step) % mt_unit_step == 0 ||
        (mi_col + mb_step) >= mi_cols) {
      intra_mt->intra_sync_write_ptr(intra_row_mt_sync, mt_thread_id,
                                     mt_unit_col, mt_unit_cols);
      ++mt_unit_col;
    }
  }
  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
}